

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::setModel(Picker *this,QAbstractItemModel *model)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  PickerPrivate *pPVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  code *local_a0;
  quintptr local_98;
  QAbstractItemModel *pQStack_90;
  code *local_88;
  quintptr local_80;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  if (model == (QAbstractItemModel *)0x0) {
    setModel();
  }
  else {
    pQVar1 = (QObject *)((this->d).d)->model;
    if (pQVar1 != (QObject *)0x0) {
      local_a0 = QAbstractItemModel::dataChanged;
      local_98 = 0;
      local_88 = _q_dataChanged;
      local_80 = 0;
      QObject::disconnectImpl
                (pQVar1,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_a0 = QAbstractItemModel::rowsAboutToBeInserted;
      local_98 = 0;
      local_88 = _q_updateIndexBeforeChange;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_a0 = QAbstractItemModel::rowsInserted;
      local_98 = 0;
      local_88 = _q_rowsInserted;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_a0 = QAbstractItemModel::rowsAboutToBeRemoved;
      local_98 = 0;
      local_88 = _q_updateIndexBeforeChange;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_a0 = QAbstractItemModel::rowsRemoved;
      local_98 = 0;
      local_88 = _q_rowsRemoved;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_a0 = QObject::destroyed;
      local_98 = 0;
      local_88 = _q_modelDestroyed;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QObject::staticMetaObject);
      local_a0 = QAbstractItemModel::modelAboutToBeReset;
      local_98 = 0;
      local_88 = _q_updateIndexBeforeChange;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      local_a0 = QAbstractItemModel::modelReset;
      local_98 = 0;
      local_88 = _q_modelReset;
      local_80 = 0;
      QObject::disconnectImpl
                ((QObject *)((this->d).d)->model,&local_a0,(QObject *)this,&local_88,
                 (QMetaObject *)&QAbstractItemModel::staticMetaObject);
      pQVar2 = ((this->d).d)->model;
      if ((pQVar2 != (QAbstractItemModel *)0x0) &&
         (*(Picker **)(*(long *)(pQVar2 + 8) + 0x10) == this)) {
        (**(code **)(*(long *)pQVar2 + 0x20))();
      }
    }
    ((this->d).d)->model = model;
    local_a0 = QAbstractItemModel::dataChanged;
    local_98 = 0;
    local_88 = _q_dataChanged;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QSlotObject<void_(QtMWidgets::Picker::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = _q_dataChanged;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_38,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_38);
    local_a0 = QAbstractItemModel::rowsAboutToBeInserted;
    local_98 = 0;
    local_88 = _q_updateIndexBeforeChange;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::Picker::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar6 + 4) = _q_updateIndexBeforeChange;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_40,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    local_a0 = QAbstractItemModel::rowsInserted;
    local_98 = 0;
    local_88 = _q_rowsInserted;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QSlotObject<void_(QtMWidgets::Picker::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = _q_rowsInserted;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_48,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    local_a0 = QAbstractItemModel::rowsAboutToBeRemoved;
    local_98 = 0;
    local_88 = _q_updateIndexBeforeChange;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::Picker::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar6 + 4) = _q_updateIndexBeforeChange;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_50,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_a0 = QAbstractItemModel::rowsRemoved;
    local_98 = 0;
    local_88 = _q_rowsRemoved;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QSlotObject<void_(QtMWidgets::Picker::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = _q_rowsRemoved;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_58,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    local_a0 = QObject::destroyed;
    local_98 = 0;
    local_88 = _q_modelDestroyed;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::Picker::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar6 + 4) = _q_modelDestroyed;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    local_a0 = QAbstractItemModel::modelAboutToBeReset;
    local_98 = 0;
    local_88 = _q_updateIndexBeforeChange;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::Picker::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar6 + 4) = _q_updateIndexBeforeChange;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    local_a0 = QAbstractItemModel::modelReset;
    local_98 = 0;
    local_88 = _q_modelReset;
    local_80 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::Picker::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar6 + 4) = _q_modelReset;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_70,(void **)model,(QObject *)&local_a0,(void **)this,
               (QSlotObjectBase *)&local_88,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    pPVar3 = (this->d).d;
    pQVar2 = pPVar3->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a0,&pPVar3->root);
    iVar4 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)&local_a0);
    if (iVar4 != 0) {
      pPVar3 = (this->d).d;
      pQVar2 = pPVar3->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a0,&pPVar3->root);
      iVar4 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)&local_a0);
      if (0 < iVar4) {
        iVar4 = 0;
        do {
          pPVar3 = (this->d).d;
          pQVar2 = pPVar3->model;
          iVar5 = pPVar3->modelColumn;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_88,&pPVar3->root);
          (**(code **)(*(long *)pQVar2 + 0x60))
                    ((QModelIndex *)&local_a0,pQVar2,iVar4,iVar5,(QModelIndex *)&local_88);
          if ((pQStack_90 != (QAbstractItemModel *)0x0) &&
             (uVar7 = (**(code **)(*(long *)pQStack_90 + 0x138))
                                (pQStack_90,(QModelIndex *)&local_a0), (uVar7 & 0x20) != 0)) {
            pPVar3 = (this->d).d;
            pQVar2 = pPVar3->model;
            iVar5 = pPVar3->modelColumn;
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      ((QModelIndex *)&local_88,&pPVar3->root);
            (**(code **)(*(long *)pQVar2 + 0x60))
                      ((QModelIndex *)&local_a0,pQVar2,iVar4,iVar5,(QModelIndex *)&local_88);
            QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,(QModelIndex *)&local_a0);
            setCurrentIndex(this,iVar4);
            return;
          }
          iVar4 = iVar4 + 1;
          pPVar3 = (this->d).d;
          pQVar2 = pPVar3->model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_a0,&pPVar3->root);
          iVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)&local_a0);
        } while (iVar4 < iVar5);
      }
    }
    setCurrentIndex(this,-1);
    local_a0 = (code *)0xffffffffffffffff;
    local_98 = 0;
    pQStack_90 = (QAbstractItemModel *)0x0;
    QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,(QModelIndex *)&local_a0);
  }
  return;
}

Assistant:

void
Picker::setModel( QAbstractItemModel * model )
{
	if( !model )
	{
		qWarning( "QtMWidgets::Picker::setModel: cannot set a 0 model" );
		return;
	}

	if( d->model )
	{
		disconnect( d->model, &QAbstractItemModel::dataChanged,
			this, &Picker::_q_dataChanged );
		disconnect( d->model, &QAbstractItemModel::rowsAboutToBeInserted,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::rowsInserted,
			this, &Picker::_q_rowsInserted );
		disconnect( d->model, &QAbstractItemModel::rowsAboutToBeRemoved,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::rowsRemoved,
			this, &Picker::_q_rowsRemoved );
		disconnect( d->model, &QAbstractItemModel::destroyed,
			this, &Picker::_q_modelDestroyed );
		disconnect( d->model, &QAbstractItemModel::modelAboutToBeReset,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::modelReset,
			this, &Picker::_q_modelReset );

		if( d->model->QObject::parent() == this )
			delete d->model;
	}

	d->model = model;

	connect( model, &QAbstractItemModel::dataChanged,
		this, &Picker::_q_dataChanged );
	connect( model, &QAbstractItemModel::rowsAboutToBeInserted,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::rowsInserted,
		this, &Picker::_q_rowsInserted );
	connect( model, &QAbstractItemModel::rowsAboutToBeRemoved,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::rowsRemoved,
		this, &Picker::_q_rowsRemoved );
	connect( model, &QAbstractItemModel::destroyed,
		this, &Picker::_q_modelDestroyed );
	connect( model, &QAbstractItemModel::modelAboutToBeReset,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::modelReset,
		this, &Picker::_q_modelReset );

	bool currentReset = false;

	if( count() )
	{
		for( int pos = 0; pos < count(); ++pos )
		{
			if( d->model->index( pos, d->modelColumn, d->root ).flags() & Qt::ItemIsEnabled )
			{
				d->topItemIndex = d->model->index( pos, d->modelColumn, d->root );
				setCurrentIndex( pos );
				currentReset = true;
				break;
			}
		}
	}

	if( !currentReset )
	{
		setCurrentIndex( -1 );
		d->topItemIndex = QModelIndex();
	}
}